

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# block_encoder_inc.h
# Opt level: O0

void BuildAndStoreEntropyCodesLiteral
               (MemoryManager *m,BlockEncoder *self,HistogramLiteral *histograms,
               size_t histograms_size,size_t alphabet_size,HuffmanTree *tree,size_t *storage_ix,
               uint8_t *storage)

{
  size_t n;
  long lVar1;
  uint16_t *local_60;
  uint8_t *local_58;
  size_t ix;
  size_t i;
  size_t table_size;
  HuffmanTree *tree_local;
  size_t alphabet_size_local;
  size_t histograms_size_local;
  HistogramLiteral *histograms_local;
  BlockEncoder *self_local;
  MemoryManager *m_local;
  
  n = histograms_size * self->histogram_length_;
  if (n == 0) {
    local_58 = (uint8_t *)0x0;
  }
  else {
    local_58 = (uint8_t *)BrotliAllocate(m,n);
  }
  self->depths_ = local_58;
  if (n == 0) {
    local_60 = (uint16_t *)0x0;
  }
  else {
    local_60 = (uint16_t *)BrotliAllocate(m,n * 2);
  }
  self->bits_ = local_60;
  for (ix = 0; ix < histograms_size; ix = ix + 1) {
    lVar1 = ix * self->histogram_length_;
    BuildAndStoreHuffmanTree
              (histograms[ix].data_,self->histogram_length_,alphabet_size,tree,self->depths_ + lVar1
               ,self->bits_ + lVar1,storage_ix,storage);
  }
  return;
}

Assistant:

static void FN(BuildAndStoreEntropyCodes)(MemoryManager* m, BlockEncoder* self,
    const HistogramType* histograms, const size_t histograms_size,
    const size_t alphabet_size, HuffmanTree* tree,
    size_t* storage_ix, uint8_t* storage) {
  const size_t table_size = histograms_size * self->histogram_length_;
  self->depths_ = BROTLI_ALLOC(m, uint8_t, table_size);
  self->bits_ = BROTLI_ALLOC(m, uint16_t, table_size);
  if (BROTLI_IS_OOM(m)) return;

  {
    size_t i;
    for (i = 0; i < histograms_size; ++i) {
      size_t ix = i * self->histogram_length_;
      BuildAndStoreHuffmanTree(&histograms[i].data_[0], self->histogram_length_,
          alphabet_size, tree, &self->depths_[ix], &self->bits_[ix],
          storage_ix, storage);
    }
  }
}